

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void ServerRegisterHandlers(Remote_evpath_state *ev_state)

{
  long in_RDI;
  
  CMregister_handler(*(undefined8 *)(in_RDI + 8),OpenHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x10),OpenSimpleHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x28),GetRequestHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x30),ReadRequestHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x48),KillServerHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x50),KillResponseHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x58),StatusServerHandler,in_RDI);
  CMregister_handler(*(undefined8 *)(in_RDI + 0x60),StatusResponseHandler,in_RDI);
  return;
}

Assistant:

void ServerRegisterHandlers(struct Remote_evpath_state &ev_state)
{
    CMregister_handler(ev_state.OpenFileFormat, OpenHandler, &ev_state);
    CMregister_handler(ev_state.OpenSimpleFileFormat, OpenSimpleHandler, &ev_state);
    CMregister_handler(ev_state.GetRequestFormat, GetRequestHandler, &ev_state);
    CMregister_handler(ev_state.ReadRequestFormat, ReadRequestHandler, &ev_state);
    CMregister_handler(ev_state.KillServerFormat, KillServerHandler, &ev_state);
    CMregister_handler(ev_state.KillResponseFormat, KillResponseHandler, &ev_state);
    CMregister_handler(ev_state.StatusServerFormat, StatusServerHandler, &ev_state);
    CMregister_handler(ev_state.StatusResponseFormat, StatusResponseHandler, &ev_state);
}